

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
pull_attr(_internal_exr_context *ctxt,_internal_exr_part *curpart,uint8_t init_byte,
         _internal_exr_seq_scratch *scratch)

{
  uint maxlen_00;
  int iVar1;
  uint32_t uVar2;
  exr_result_t eVar3;
  exr_attr_string_t *attrdata;
  long in_RCX;
  undefined1 in_DL;
  long in_RDI;
  int32_t n;
  int32_t maxlen;
  uint8_t *strptr;
  exr_attribute_t *nattr;
  int32_t attrsz;
  int32_t typelen;
  int32_t namelen;
  exr_result_t rv;
  char type [256];
  char name [256];
  undefined1 *puVar4;
  undefined4 in_stack_fffffffffffffda0;
  int32_t in_stack_fffffffffffffda4;
  _internal_exr_seq_scratch *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  _internal_exr_context *ctxt_00;
  _internal_exr_part *curpart_00;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  exr_attr_preview_t *in_stack_fffffffffffffdd8;
  uint8_t maxval;
  int32_t in_stack_fffffffffffffde0;
  exr_attribute_type_t in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  int32_t in_stack_fffffffffffffdec;
  exr_attribute_list_t *in_stack_fffffffffffffdf0;
  exr_attr_string_vector_t *in_stack_fffffffffffffdf8;
  _internal_exr_seq_scratch *in_stack_fffffffffffffe00;
  _internal_exr_context *in_stack_fffffffffffffe08;
  exr_attribute_t **in_stack_fffffffffffffe10;
  exr_attribute_t **in_stack_fffffffffffffe20;
  int32_t in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed9;
  _internal_exr_seq_scratch *in_stack_fffffffffffffee0;
  _internal_exr_context *in_stack_fffffffffffffee8;
  exr_result_t local_4;
  
  iVar6 = 0;
  uVar5 = 0;
  curpart_00 = (_internal_exr_part *)0x0;
  ctxt_00 = (_internal_exr_context *)0x0;
  maxlen_00 = (uint)*(byte *)(in_RDI + 2);
  uVar7 = 1;
  local_4 = read_text((_internal_exr_context *)0x0,(char *)0x0,(int32_t *)0x0,maxlen_00,
                      in_stack_fffffffffffffda8,
                      (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  if ((local_4 == 0) &&
     (local_4 = read_text((_internal_exr_context *)CONCAT44(iVar6,uVar5),(char *)curpart_00,
                          (int32_t *)ctxt_00,maxlen_00,in_stack_fffffffffffffda8,
                          (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
     local_4 == 0)) {
    if (uVar7 == 0) {
      local_4 = (**(code **)(in_RDI + 0x40))
                          (in_RDI,6,"Invalid empty string encountered parsing attribute name");
    }
    else if (iVar6 == 0) {
      local_4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,6,
                           "Invalid empty string encountered parsing attribute type for attribute \'%s\'"
                           ,&stack0xfffffffffffffed8);
    }
    else {
      iVar1 = (**(code **)(in_RCX + 0x20))(in_RCX,&stack0xfffffffffffffdc8,4);
      if (iVar1 == 0) {
        uVar2 = one_to_native32(0);
        local_4 = check_req_attr((_internal_exr_context *)CONCAT44(iVar6,uVar2),curpart_00,
                                 (_internal_exr_seq_scratch *)ctxt_00,
                                 (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                 (char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
        if (local_4 == 0x20) {
          iVar1 = strcmp(&stack0xfffffffffffffdd8,"string");
          if (iVar1 == 0) {
            eVar3 = check_bad_attrsz((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                     (_internal_exr_seq_scratch *)curpart_00,
                                     (int32_t)((ulong)ctxt_00 >> 0x20),(int32_t)ctxt_00,
                                     (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                     (char *)in_stack_fffffffffffffda8,
                                     (int32_t *)
                                     CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
            if (eVar3 != 0) {
              return eVar3;
            }
            puVar4 = &stack0xfffffffffffffdc0;
            eVar3 = exr_attr_list_add((exr_context_t)in_stack_fffffffffffffdf8,
                                      in_stack_fffffffffffffdf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffdec,
                                                       in_stack_fffffffffffffde8),
                                      in_stack_fffffffffffffde4,in_stack_fffffffffffffde0,
                                      (uint8_t **)in_stack_fffffffffffffdd8,
                                      in_stack_fffffffffffffe10);
          }
          else {
            puVar4 = &stack0xfffffffffffffdc0;
            eVar3 = exr_attr_list_add_by_type
                              ((exr_context_t)in_stack_fffffffffffffe08,
                               (exr_attribute_list_t *)in_stack_fffffffffffffe00,
                               (char *)in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
                               in_stack_fffffffffffffdec,
                               (uint8_t **)
                               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                               in_stack_fffffffffffffe20);
          }
          if (eVar3 == 0) {
            attrdata = (exr_attr_string_t *)
                       (ulong)*(uint *)((long)&(curpart_00->attributes).entries + 4);
            maxval = (uint8_t)in_stack_fffffffffffffde0;
            switch(attrdata) {
            case (exr_attr_string_t *)0x0:
            case (exr_attr_string_t *)0x1e:
            default:
              local_4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,"Invalid type \'%s\' for attribute \'%s\'",
                                   &stack0xfffffffffffffdd8,&stack0xfffffffffffffed8,
                                   *(code **)(in_RDI + 0x48),puVar4);
              break;
            case (exr_attr_string_t *)0x1:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x2:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x3:
              local_4 = extract_attr_chlist(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                            (exr_attr_chlist_t *)
                                            CONCAT71(in_stack_fffffffffffffed9,in_DL),
                                            in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                            in_stack_fffffffffffffec4);
              break;
            case (exr_attr_string_t *)0x4:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x5:
              local_4 = extract_attr_uint8((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,&ctxt_00->mode,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,maxval);
              break;
            case (exr_attr_string_t *)0x6:
              local_4 = extract_attr_64bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x7:
              local_4 = extract_attr_uint8((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,&ctxt_00->mode,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,maxval);
              break;
            case (exr_attr_string_t *)0x8:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x9:
              local_4 = extract_attr_float_vector
                                  ((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                   (_internal_exr_seq_scratch *)curpart_00,
                                   (exr_attr_float_vector_t *)ctxt_00,
                                   (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                   (char *)attrdata,in_stack_fffffffffffffda4);
              break;
            case (exr_attr_string_t *)0xa:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0xb:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0xc:
              local_4 = extract_attr_uint8((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,&ctxt_00->mode,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,maxval);
              break;
            case (exr_attr_string_t *)0xd:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0xe:
              local_4 = extract_attr_64bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0xf:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x10:
              local_4 = extract_attr_64bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x11:
              local_4 = extract_attr_preview
                                  ((_internal_exr_context *)
                                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                   (_internal_exr_seq_scratch *)
                                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                                   in_stack_fffffffffffffdd8,(char *)(ulong)uVar7,
                                   (char *)CONCAT44(iVar6,uVar2),
                                   (int32_t)((ulong)curpart_00 >> 0x20));
              break;
            case (exr_attr_string_t *)0x12:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x13:
              local_4 = extract_attr_string(ctxt_00,(_internal_exr_seq_scratch *)
                                                    CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                            attrdata,(char *)CONCAT44(in_stack_fffffffffffffda4,
                                                                      in_stack_fffffffffffffda0),
                                            (char *)ctxt_00,0,(char *)(ulong)uVar7);
              break;
            case (exr_attr_string_t *)0x14:
              local_4 = extract_attr_string_vector
                                  (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                   in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
                                   (char *)CONCAT44(in_stack_fffffffffffffdec,
                                                    in_stack_fffffffffffffde8),
                                   in_stack_fffffffffffffde4);
              break;
            case (exr_attr_string_t *)0x15:
              local_4 = extract_attr_tiledesc
                                  ((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                   (_internal_exr_seq_scratch *)curpart_00,
                                   (exr_attr_tiledesc_t *)ctxt_00,
                                   (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                   (char *)attrdata,in_stack_fffffffffffffda4);
              break;
            case (exr_attr_string_t *)0x16:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x17:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x18:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x19:
              local_4 = extract_attr_64bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x1a:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x1b:
              local_4 = extract_attr_32bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x1c:
              local_4 = extract_attr_64bit((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                           (_internal_exr_seq_scratch *)curpart_00,ctxt_00,
                                           (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                           (char *)attrdata,in_stack_fffffffffffffda4,
                                           in_stack_fffffffffffffde0);
              break;
            case (exr_attr_string_t *)0x1d:
              local_4 = extract_attr_opaque((_internal_exr_context *)CONCAT44(iVar6,uVar2),
                                            (_internal_exr_seq_scratch *)curpart_00,
                                            (exr_attr_opaquedata_t *)ctxt_00,
                                            (char *)CONCAT44(maxlen_00,in_stack_fffffffffffffdb0),
                                            (char *)attrdata,in_stack_fffffffffffffda4);
            }
            if (local_4 != 0) {
              exr_attr_list_remove
                        ((exr_context_t)CONCAT44(iVar6,uVar2),(exr_attribute_list_t *)curpart_00,
                         (exr_attribute_t *)ctxt_00);
            }
          }
          else {
            local_4 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,eVar3,"Unable to initialize attribute \'%s\', type \'%s\'",
                                 &stack0xfffffffffffffed8,&stack0xfffffffffffffdd8);
          }
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,iVar1,
                             "Unable to read attribute size for attribute \'%s\', type \'%s\'",
                             &stack0xfffffffffffffed8,&stack0xfffffffffffffdd8);
      }
    }
  }
  return local_4;
}

Assistant:

static exr_result_t
pull_attr (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_part*        curpart,
    uint8_t                           init_byte,
    struct _internal_exr_seq_scratch* scratch)
{
    char             name[256], type[256];
    exr_result_t     rv;
    int32_t          namelen = 0, typelen = 0;
    int32_t          attrsz = 0;
    exr_attribute_t* nattr  = NULL;
    uint8_t*         strptr = NULL;
    const int32_t    maxlen = ctxt->max_name_length;

    name[0] = (char) init_byte;
    namelen = 1;

    rv = read_text (ctxt, name, &namelen, maxlen, scratch, "attribute name");
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = read_text (ctxt, type, &typelen, maxlen, scratch, "attribute type");
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (namelen == 0)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "Invalid empty string encountered parsing attribute name");

    if (typelen == 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "Invalid empty string encountered parsing attribute type for attribute '%s'",
            name);

    rv = scratch->sequential_read (scratch, &attrsz, sizeof (int32_t));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to read attribute size for attribute '%s', type '%s'",
            name,
            type);
    attrsz = (int32_t) one_to_native32 ((uint32_t) attrsz);

    rv = check_req_attr (ctxt, curpart, scratch, name, type, attrsz);
    if (rv != EXR_ERR_UNKNOWN) return rv;

    /* not a required attr, just a normal one, optimize for string type to avoid double malloc */
    if (!strcmp (type, "string"))
    {
        int32_t n;
        rv = check_bad_attrsz (ctxt, scratch, attrsz, 1, name, type, &n);
        if (rv != EXR_ERR_SUCCESS) return rv;

        rv = exr_attr_list_add (
            (exr_context_t) ctxt,
            &(curpart->attributes),
            name,
            EXR_ATTR_STRING,
            n + 1,
            &strptr,
            &nattr);
    }
    else
    {
        rv = exr_attr_list_add_by_type (
            (exr_context_t) ctxt,
            &(curpart->attributes),
            name,
            type,
            0,
            NULL,
            &nattr);
    }

    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type '%s'",
            name,
            type);

    switch (nattr->type)
    {
        case EXR_ATTR_BOX2I:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->box2i, name, type, attrsz, 4);
            break;
        case EXR_ATTR_BOX2F:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->box2f, name, type, attrsz, 4);
            break;
        case EXR_ATTR_CHLIST:
            rv = extract_attr_chlist (
                ctxt, scratch, nattr->chlist, name, type, attrsz);
            break;
        case EXR_ATTR_CHROMATICITIES:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->chromaticities, name, type, attrsz, 8);
            break;
        case EXR_ATTR_COMPRESSION:
            rv = extract_attr_uint8 (
                ctxt,
                scratch,
                &(nattr->uc),
                name,
                type,
                attrsz,
                (uint8_t) EXR_COMPRESSION_LAST_TYPE);
            break;
        case EXR_ATTR_ENVMAP:
            rv = extract_attr_uint8 (
                ctxt,
                scratch,
                &(nattr->uc),
                name,
                type,
                attrsz,
                (uint8_t) EXR_ENVMAP_LAST_TYPE);
            break;
        case EXR_ATTR_LINEORDER:
            rv = extract_attr_uint8 (
                ctxt,
                scratch,
                &(nattr->uc),
                name,
                type,
                attrsz,
                (uint8_t) EXR_LINEORDER_LAST_TYPE);
            break;
        case EXR_ATTR_DOUBLE:
            rv = extract_attr_64bit (
                ctxt, scratch, &(nattr->d), name, type, attrsz, 1);
            break;
        case EXR_ATTR_FLOAT:
            rv = extract_attr_32bit (
                ctxt, scratch, &(nattr->f), name, type, attrsz, 1);
            break;
        case EXR_ATTR_FLOAT_VECTOR:
            rv = extract_attr_float_vector (
                ctxt, scratch, nattr->floatvector, name, type, attrsz);
            break;
        case EXR_ATTR_INT:
            rv = extract_attr_32bit (
                ctxt, scratch, &(nattr->i), name, type, attrsz, 1);
            break;
        case EXR_ATTR_KEYCODE:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->keycode, name, type, attrsz, 7);
            break;
        case EXR_ATTR_M33F:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->m33f->m, name, type, attrsz, 9);
            break;
        case EXR_ATTR_M33D:
            rv = extract_attr_64bit (
                ctxt, scratch, nattr->m33d->m, name, type, attrsz, 9);
            break;
        case EXR_ATTR_M44F:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->m44f->m, name, type, attrsz, 16);
            break;
        case EXR_ATTR_M44D:
            rv = extract_attr_64bit (
                ctxt, scratch, nattr->m44d->m, name, type, attrsz, 16);
            break;
        case EXR_ATTR_PREVIEW:
            rv = extract_attr_preview (
                ctxt, scratch, nattr->preview, name, type, attrsz);
            break;
        case EXR_ATTR_RATIONAL:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->rational, name, type, attrsz, 2);
            break;
        case EXR_ATTR_STRING:
            rv = extract_attr_string (
                ctxt,
                scratch,
                nattr->string,
                name,
                type,
                attrsz,
                (char*) strptr);
            break;
        case EXR_ATTR_STRING_VECTOR:
            rv = extract_attr_string_vector (
                ctxt, scratch, nattr->stringvector, name, type, attrsz);
            break;
        case EXR_ATTR_TILEDESC:
            rv = extract_attr_tiledesc (
                ctxt, scratch, nattr->tiledesc, name, type, attrsz);
            break;
        case EXR_ATTR_TIMECODE:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->timecode, name, type, attrsz, 2);
            break;
        case EXR_ATTR_V2I:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->v2i->arr, name, type, attrsz, 2);
            break;
        case EXR_ATTR_V2F:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->v2f->arr, name, type, attrsz, 2);
            break;
        case EXR_ATTR_V2D:
            rv = extract_attr_64bit (
                ctxt, scratch, nattr->v2d->arr, name, type, attrsz, 2);
            break;
        case EXR_ATTR_V3I:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->v3i->arr, name, type, attrsz, 3);
            break;
        case EXR_ATTR_V3F:
            rv = extract_attr_32bit (
                ctxt, scratch, nattr->v3f->arr, name, type, attrsz, 3);
            break;
        case EXR_ATTR_V3D:
            rv = extract_attr_64bit (
                ctxt, scratch, nattr->v3d->arr, name, type, attrsz, 3);
            break;
        case EXR_ATTR_OPAQUE:
            rv = extract_attr_opaque (
                ctxt, scratch, nattr->opaque, name, type, attrsz);
            break;
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default:
            rv = ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid type '%s' for attribute '%s'",
                type,
                name);
            break;
    }
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_list_remove (
            (exr_context_t) ctxt, &(curpart->attributes), nattr);
    }

    return rv;
}